

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::pickScreenColor(QColorDialogPrivate *this)

{
  long lVar1;
  QRgb QVar2;
  QPoint *slot;
  QPlatformIntegration *pQVar3;
  long *plVar4;
  ulong uVar5;
  QWindow *pQVar6;
  QColorDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QColor QVar7;
  QPlatformServiceColorPicker *colorPicker;
  QPlatformServices *platformServices;
  QColorDialog *q;
  QPoint globalPos;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QWidget *in_stack_ffffffffffffff50;
  QColorDialogPrivate *in_stack_ffffffffffffff58;
  QColorPickingEventFilter *in_stack_ffffffffffffff60;
  QColorDialogPrivate *in_stack_ffffffffffffff68;
  QColorDialogPrivate *context;
  undefined1 in_stack_ffffffffffffffb0 [16];
  QCursor local_38;
  Connection local_20;
  undefined8 local_18;
  ConnectionType in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  context = in_RDI;
  slot = (QPoint *)q_func(in_RDI);
  pQVar3 = QGuiApplicationPrivate::platformIntegration();
  plVar4 = (long *)(**(code **)(*(long *)pQVar3 + 0x98))();
  if ((plVar4 != (long *)0x0) && (uVar5 = (**(code **)(*plVar4 + 0x28))(plVar4,0), (uVar5 & 1) != 0)
     ) {
    pQVar6 = QWidget::windowHandle(in_stack_ffffffffffffff50);
    plVar4 = (long *)(**(code **)(*plVar4 + 0x30))(plVar4,pQVar6);
    if (plVar4 != (long *)0x0) {
      QObject::
      connect<void(QPlatformServiceColorPicker::*)(QColor_const&),QColorDialogPrivate::pickScreenColor()::__0>
                (in_stack_ffffffffffffffb0._0_8_,(offset_in_QPlatformServiceColorPicker_to_subr)slot
                 ,(ContextType *)context,(anon_class_16_2_fa435629_for_o *)slot,
                 in_stack_fffffffffffffff0);
      QMetaObject::Connection::~Connection(&local_20);
      (**(code **)(*plVar4 + 0x60))();
      goto LAB_00737857;
    }
  }
  if (in_RDI->colorPickingEventFilter == (QColorPickingEventFilter *)0x0) {
    in_stack_ffffffffffffff68 = (QColorDialogPrivate *)operator_new(0x18);
    QtPrivate::QColorPickingEventFilter::QColorPickingEventFilter
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               &in_stack_ffffffffffffff50->super_QObject);
    in_RDI->colorPickingEventFilter = (QColorPickingEventFilter *)in_stack_ffffffffffffff68;
  }
  QObject::installEventFilter((QObject *)slot);
  QVar2 = QtPrivate::QColorShower::currentColor(in_RDI->cs);
  in_RDI->beforeScreenColorPicking = QVar2;
  QCursor::QCursor(&local_38,CrossCursor);
  QWidget::grabMouse(in_stack_ffffffffffffff50,
                     (QCursor *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QCursor::~QCursor(&local_38);
  QWidget::grabKeyboard(in_stack_ffffffffffffff50);
  QWidget::setMouseTracking
            (in_stack_ffffffffffffff50,SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0));
  QWidget::setDisabled(in_stack_ffffffffffffff50,SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0));
  QWidget::setDisabled(in_stack_ffffffffffffff50,SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0));
  if (in_RDI->eyeDropperButton != (QPushButton *)0x0) {
    QWidget::setDisabled(in_stack_ffffffffffffff50,SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0))
    ;
    QCursor::pos();
    QVar7 = grabScreenColor(in_stack_ffffffffffffffb0._8_8_,in_stack_ffffffffffffffb0._0_8_);
    local_18 = QVar7._0_8_;
    QColorDialog::setCurrentColor
              ((QColorDialog *)in_stack_ffffffffffffff50,
               (QColor *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    updateColorLabelText(in_stack_ffffffffffffff68,slot);
  }
LAB_00737857:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorDialogPrivate::pickScreenColor()
{
    Q_Q(QColorDialog);

    auto *platformServices = QGuiApplicationPrivate::platformIntegration()->services();
    if (platformServices && platformServices->hasCapability(QPlatformServices::Capability::ColorPicking)) {
        if (auto *colorPicker = platformServices->colorPicker(q->windowHandle())) {
            q->connect(colorPicker, &QPlatformServiceColorPicker::colorPicked, q,
                       [q, colorPicker](const QColor &color) {
                           colorPicker->deleteLater();
                           q->setCurrentColor(color);
                       });
            colorPicker->pickColor();
            return;
        }
    }

    if (!colorPickingEventFilter)
        colorPickingEventFilter = new QColorPickingEventFilter(this, q);
    q->installEventFilter(colorPickingEventFilter);
    // If user pushes Escape, the last color before picking will be restored.
    beforeScreenColorPicking = cs->currentColor();
#ifndef QT_NO_CURSOR
    q->grabMouse(Qt::CrossCursor);
#else
    q->grabMouse();
#endif

#ifdef Q_OS_WIN32
    // On Windows mouse tracking doesn't work over other processes's windows
    updateTimer->start(30);

    // HACK: Because mouse grabbing doesn't work across processes, we have to have a dummy,
    // invisible window to catch the mouse click, otherwise we will click whatever we clicked
    // and loose focus.
    dummyTransparentWindow.show();
#endif
    q->grabKeyboard();
    /* With setMouseTracking(true) the desired color can be more precisely picked up,
     * and continuously pushing the mouse button is not necessary.
     */
    q->setMouseTracking(true);

    addCusBt->setDisabled(true);
    buttons->setDisabled(true);
    if (eyeDropperButton) {
        eyeDropperButton->setDisabled(true);
        const QPoint globalPos = QCursor::pos();
        q->setCurrentColor(grabScreenColor(globalPos));
        updateColorLabelText(globalPos);
    }
}